

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseMessage.h
# Opt level: O0

void __thiscall
SGParser::Generator::ParseMessage::SetParseMessage
          (ParseMessage *this,Type type,String *name,String *message,uint id,size_t line,
          size_t offset,String *fileName,uint flags)

{
  size_t line_local;
  uint id_local;
  String *message_local;
  String *name_local;
  Type type_local;
  ParseMessage *this_local;
  
  this->Flags = type | flags & 0xfffffff0;
  std::__cxx11::string::operator=((string *)&this->Name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->Message,(string *)message);
  this->Id = id;
  this->Line = line;
  this->Offset = offset;
  std::__cxx11::string::operator=((string *)&this->FileName,(string *)fileName);
  return;
}

Assistant:

void SetParseMessage(Type type, const String& name, const String& message,
                         unsigned id = 0u, size_t line = NoValue, size_t offset = NoValue,
                         const String& fileName = String{}, unsigned flags = 0u) {
        Flags    = type | (flags & ~TypeMask);
        Name     = name;
        Message  = message;
        Id       = id;
        Line     = line;
        Offset   = offset;
        FileName = fileName;
    }